

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_18;
  char acStack_14 [4];
  int x;
  char eme [8];
  
  eme[0] = '\0';
  eme[1] = '\0';
  eme[2] = '\0';
  eme[3] = '\0';
  setlocale(6,anon_var_dwarf_6ee + 0x3b);
  _acStack_14 = 0x6d33333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_14);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6c2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_18);
  if (local_18 == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ee);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6f8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '3', 'm', 0};
    cout << eme;

    int x;

    cout << "Você acredita que é capaz de amar o destino que escolheu?" << endl;
    cout << "Digite 1 para sim e 0 para não." << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Friedrich Nietzsche concorda com você." << endl;
        cout << "Para uma reafirmação disso, leia 'Além do bem e do mal'." << endl;
    }
    else
    {
        cout << "Seria bom começar a viver os pre-socráticos." << endl;
    }

    return 0;
}